

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void define_gf_group(AV1_COMP *cpi,EncodeFrameParams *frame_params,int is_final_pass)

{
  AV1_PRIMARY *pAVar1;
  AV1_PRIMARY *pAVar2;
  FIRSTPASS_STATS *position;
  AV1_PRIMARY *pAVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  GFConfig *pGVar9;
  int in_EDX;
  long in_RSI;
  AV1_COMP *in_RDI;
  bool bVar10;
  int roll_back;
  int unbalanced_gf;
  int single_overlay_left;
  int next_gf_len;
  int allow_gf_length_reduction;
  int alt_offset;
  int use_alt_ref;
  int can_disable_internal_arfs;
  int active_min_gf_interval;
  int can_disable_arf;
  GF_GROUP_STATS gf_stats;
  int is_intra_only;
  int i;
  int f_h;
  int f_w;
  RateControlCfg *rc_cfg;
  GFConfig *gf_cfg;
  GF_GROUP *gf_group;
  FIRSTPASS_STATS *start_pos;
  FIRSTPASS_STATS next_frame;
  TWO_PASS *twopass;
  AV1EncoderConfig *oxcf;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  PRIMARY_RATE_CONTROL *p_rc_00;
  AV1_COMP *in_stack_fffffffffffffde0;
  RATE_CONTROL *rc_00;
  bool local_216;
  bool local_214;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  FIRSTPASS_STATS *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  AV1_COMP *in_stack_fffffffffffffe30;
  GF_GROUP_STATS *in_stack_fffffffffffffe40;
  int *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe74;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  AV1_COMP *in_stack_fffffffffffffe88;
  double local_168;
  FIRSTPASS_STATS *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeac;
  
  pAVar1 = in_RDI->ppi;
  pAVar2 = in_RDI->ppi;
  position = (in_RDI->twopass_frame).stats_in;
  pAVar3 = in_RDI->ppi;
  pGVar9 = &(in_RDI->oxcf).gf_cfg;
  uVar5 = (uint)((in_RDI->rc).frames_since_key == 0);
  in_RDI->ppi->internal_altref_allowed = (uint)(1 < (in_RDI->oxcf).gf_cfg.gf_max_pyr_height);
  if (uVar5 == 0) {
    memset(&in_RDI->ppi->gf_group,0,0x58f4);
    in_RDI->gf_frame_index = '\0';
  }
  iVar6 = has_no_stats_stage(in_RDI);
  if (iVar6 == 0) {
    if (in_RDI->ppi->lap_enabled != 0) {
      correct_frames_to_key(in_stack_fffffffffffffde0);
    }
    p_rc_00 = (PRIMARY_RATE_CONTROL *)&stack0xfffffffffffffe18;
    rc_00 = (RATE_CONTROL *)&stack0xfffffffffffffeac;
    accumulate_gop_stats
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,
               in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
               (FIRSTPASS_STATS *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe40,in_stack_fffffffffffffe48);
    uVar7 = (uint)(((in_RDI->oxcf).gf_cfg.gf_min_pyr_height != 0 ^ 0xffU) & 1);
    iVar6 = (in_RDI->rc).min_gf_interval;
    if (((((in_RDI->oxcf).gf_cfg.gf_min_pyr_height < 2) &&
         (0.95 < (double)in_stack_fffffffffffffe48)) &&
        ((double)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78) <= 40.0 &&
         (double)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78) != 40.0)) &&
       (local_168 < 2000.0)) {
      in_RDI->ppi->internal_altref_allowed = 0;
    }
    if (uVar7 == 0) {
      bVar4 = false;
      if (((pAVar1->p_rc).use_arf_in_this_kf_group != 0) &&
         (bVar4 = false, in_stack_fffffffffffffeac < pGVar9->lag_in_frames)) {
        bVar4 = 2 < in_stack_fffffffffffffeac;
      }
    }
    else {
      iVar8 = is_almost_static((double)in_stack_fffffffffffffe48,(pAVar2->twopass).kf_zeromotion_pct
                               ,in_RDI->ppi->lap_enabled);
      bVar4 = false;
      if (((iVar8 == 0) && (bVar4 = false, (pAVar1->p_rc).use_arf_in_this_kf_group != 0)) &&
         (bVar4 = false, in_stack_fffffffffffffeac < pGVar9->lag_in_frames)) {
        bVar4 = 3 < in_stack_fffffffffffffeac;
      }
    }
    if (bVar4) {
      (pAVar3->gf_group).max_layer_depth_allowed = (in_RDI->oxcf).gf_cfg.gf_max_pyr_height;
    }
    else {
      (pAVar3->gf_group).max_layer_depth_allowed = 0;
    }
    if ((((in_RDI->oxcf).rc_cfg.mode == AOM_Q) && ((in_RDI->oxcf).rc_cfg.cq_level < 0x81)) ||
       (bVar10 = false, in_RDI->ppi->internal_altref_allowed == 0)) {
      iVar8 = is_lossless_requested(&(in_RDI->oxcf).rc_cfg);
      bVar10 = iVar8 == 0;
    }
    if ((bVar10) && (bVar4)) {
      iVar8 = (in_RDI->rc).frames_to_key - in_stack_fffffffffffffeac;
      local_214 = iVar8 == 0 && 4 < in_stack_fffffffffffffeac;
      bVar4 = false;
      if ((9 < in_stack_fffffffffffffeac) && (bVar4 = false, iVar8 + 1 < 9)) {
        bVar4 = (in_RDI->rc).min_gf_interval <= iVar8 + 1;
      }
      if (((local_214) || (bVar4)) && (iVar6 + 1 <= in_stack_fffffffffffffeac + -1)) {
        in_stack_fffffffffffffeac = in_stack_fffffffffffffeac + -1;
        if (in_EDX != 0) {
          (in_RDI->rc).intervals_till_gf_calculate_due = 0;
        }
        iVar8 = (pAVar1->p_rc).cur_gf_index;
        (pAVar1->p_rc).gf_intervals[iVar8] = (pAVar1->p_rc).gf_intervals[iVar8] + -1;
        reset_fpf_position(&in_RDI->twopass_frame,position);
        p_rc_00 = (PRIMARY_RATE_CONTROL *)&stack0xfffffffffffffe18;
        rc_00 = (RATE_CONTROL *)&stack0xfffffffffffffeac;
        accumulate_gop_stats
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,
                   in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
                   (FIRSTPASS_STATS *)CONCAT44(uVar7,iVar6),in_stack_fffffffffffffe40,
                   in_stack_fffffffffffffe48);
      }
    }
    update_gop_length(rc_00,p_rc_00,0,0x2ab3fe);
    av1_gop_setup_structure((AV1_COMP *)CONCAT44(uVar7,iVar6));
    set_gop_bits_boost(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,in_stack_fffffffffffffe80
                       ,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,
                       in_stack_fffffffffffffe74,in_stack_fffffffffffffea0,
                       (GF_GROUP_STATS *)CONCAT44(in_stack_fffffffffffffeac,uVar5));
    *(bool *)(in_RSI + 4) = (in_RDI->rc).frames_since_key != 0;
    local_216 = true;
    if ((pAVar3->gf_group).update_type[in_RDI->gf_frame_index] != '\x03') {
      local_216 = (pAVar3->gf_group).update_type[in_RDI->gf_frame_index] == '\x06';
    }
    *(uint *)(in_RSI + 0x10) = (uint)((local_216 ^ 0xffU) & 1);
  }
  else {
    define_gf_group_pass0((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10))
    ;
  }
  return;
}

Assistant:

static void define_gf_group(AV1_COMP *cpi, EncodeFrameParams *frame_params,
                            int is_final_pass) {
  AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FIRSTPASS_STATS next_frame;
  const FIRSTPASS_STATS *const start_pos = cpi->twopass_frame.stats_in;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  const GFConfig *const gf_cfg = &oxcf->gf_cfg;
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;
  const int f_w = cm->width;
  const int f_h = cm->height;
  int i;
  const int is_intra_only = rc->frames_since_key == 0;

  cpi->ppi->internal_altref_allowed = (gf_cfg->gf_max_pyr_height > 1);

  // Reset the GF group data structures unless this is a key
  // frame in which case it will already have been done.
  if (!is_intra_only) {
    av1_zero(cpi->ppi->gf_group);
    cpi->gf_frame_index = 0;
  }

  if (has_no_stats_stage(cpi)) {
    define_gf_group_pass0(cpi);
    return;
  }

#if CONFIG_THREE_PASS
  if (cpi->third_pass_ctx && oxcf->pass == AOM_RC_THIRD_PASS) {
    int ret = define_gf_group_pass3(cpi, frame_params, is_final_pass);
    if (ret == 0) return;

    av1_free_thirdpass_ctx(cpi->third_pass_ctx);
    cpi->third_pass_ctx = NULL;
  }
#endif  // CONFIG_THREE_PASS

  // correct frames_to_key when lookahead queue is emptying
  if (cpi->ppi->lap_enabled) {
    correct_frames_to_key(cpi);
  }

  GF_GROUP_STATS gf_stats;
  accumulate_gop_stats(cpi, is_intra_only, f_w, f_h, &next_frame, start_pos,
                       &gf_stats, &i);

  const int can_disable_arf = !gf_cfg->gf_min_pyr_height;

  // If this is a key frame or the overlay from a previous arf then
  // the error score / cost of this frame has already been accounted for.
  const int active_min_gf_interval = rc->min_gf_interval;

  // Disable internal ARFs for "still" gf groups.
  //   zero_motion_accumulator: minimum percentage of (0,0) motion;
  //   avg_sr_coded_error:      average of the SSE per pixel of each frame;
  //   avg_raw_err_stdev:       average of the standard deviation of (0,0)
  //                            motion error per block of each frame.
  const int can_disable_internal_arfs = gf_cfg->gf_min_pyr_height <= 1;
  if (can_disable_internal_arfs &&
      gf_stats.zero_motion_accumulator > MIN_ZERO_MOTION &&
      gf_stats.avg_sr_coded_error < MAX_SR_CODED_ERROR &&
      gf_stats.avg_raw_err_stdev < MAX_RAW_ERR_VAR) {
    cpi->ppi->internal_altref_allowed = 0;
  }

  int use_alt_ref;
  if (can_disable_arf) {
    use_alt_ref =
        !is_almost_static(gf_stats.zero_motion_accumulator,
                          twopass->kf_zeromotion_pct, cpi->ppi->lap_enabled) &&
        p_rc->use_arf_in_this_kf_group && (i < gf_cfg->lag_in_frames) &&
        (i >= MIN_GF_INTERVAL);
  } else {
    use_alt_ref = p_rc->use_arf_in_this_kf_group &&
                  (i < gf_cfg->lag_in_frames) && (i > 2);
  }
  if (use_alt_ref) {
    gf_group->max_layer_depth_allowed = gf_cfg->gf_max_pyr_height;
  } else {
    gf_group->max_layer_depth_allowed = 0;
  }

  int alt_offset = 0;
  // The length reduction strategy is tweaked for certain cases, and doesn't
  // work well for certain other cases.
  const int allow_gf_length_reduction =
      ((rc_cfg->mode == AOM_Q && rc_cfg->cq_level <= 128) ||
       !cpi->ppi->internal_altref_allowed) &&
      !is_lossless_requested(rc_cfg);

  if (allow_gf_length_reduction && use_alt_ref) {
    // adjust length of this gf group if one of the following condition met
    // 1: only one overlay frame left and this gf is too long
    // 2: next gf group is too short to have arf compared to the current gf

    // maximum length of next gf group
    const int next_gf_len = rc->frames_to_key - i;
    const int single_overlay_left =
        next_gf_len == 0 && i > REDUCE_GF_LENGTH_THRESH;
    // the next gf is probably going to have a ARF but it will be shorter than
    // this gf
    const int unbalanced_gf =
        i > REDUCE_GF_LENGTH_TO_KEY_THRESH &&
        next_gf_len + 1 < REDUCE_GF_LENGTH_TO_KEY_THRESH &&
        next_gf_len + 1 >= rc->min_gf_interval;

    if (single_overlay_left || unbalanced_gf) {
      const int roll_back = REDUCE_GF_LENGTH_BY;
      // Reduce length only if active_min_gf_interval will be respected later.
      if (i - roll_back >= active_min_gf_interval + 1) {
        alt_offset = -roll_back;
        i -= roll_back;
        if (is_final_pass) rc->intervals_till_gf_calculate_due = 0;
        p_rc->gf_intervals[p_rc->cur_gf_index] -= roll_back;
        reset_fpf_position(&cpi->twopass_frame, start_pos);
        accumulate_gop_stats(cpi, is_intra_only, f_w, f_h, &next_frame,
                             start_pos, &gf_stats, &i);
      }
    }
  }

  update_gop_length(rc, p_rc, i, is_final_pass);

  // Set up the structure of this Group-Of-Pictures (same as GF_GROUP)
  av1_gop_setup_structure(cpi);

  set_gop_bits_boost(cpi, i, is_intra_only, is_final_pass, use_alt_ref,
                     alt_offset, start_pos, &gf_stats);

  frame_params->frame_type =
      rc->frames_since_key == 0 ? KEY_FRAME : INTER_FRAME;
  frame_params->show_frame =
      !(gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
        gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE);
}